

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pad-otp.c
# Opt level: O1

void pad_otp(uint32_t code,uint length,char *buf)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  byte *pbVar6;
  char *pcVar7;
  
  pcVar7 = buf + 1;
  uVar5 = length - 1;
  uVar3 = 0;
  pbVar6 = (byte *)buf;
  do {
    *pbVar6 = (char)code + (char)(code / 10) * -10 | 0x30;
    pbVar6 = pbVar6 + 1;
    uVar3 = uVar3 + 1;
    pcVar7 = pcVar7 + 1;
    uVar5 = uVar5 - 1;
    bVar2 = 9 < code;
    code = code / 10;
  } while (bVar2);
  if (uVar3 < length) {
    memset(pbVar6,0x30,(ulong)(~uVar3 + length) + 1);
    pbVar6 = (byte *)(pcVar7 + uVar5);
  }
  *pbVar6 = 0;
  uVar3 = (int)pbVar6 - (int)buf;
  if (1 < uVar3) {
    uVar3 = uVar3 >> 1;
    pbVar6 = pbVar6 + ~(ulong)buf;
    uVar4 = 0;
    do {
      cVar1 = buf[uVar4];
      buf[uVar4] = buf[(ulong)pbVar6 & 0xffffffff];
      buf[(ulong)pbVar6 & 0xffffffff] = cVar1;
      uVar4 = uVar4 + 1;
      pbVar6 = pbVar6 + -1;
    } while (uVar3 + (uVar3 == 0) != uVar4);
  }
  return;
}

Assistant:

void pad_otp(uint32_t code, unsigned length, char *buf) {
  unsigned i;
  unsigned len;
  char *pbuf = buf;

  do {
    int digit = code % 10;
    *(pbuf++) = '0' + digit;
    code /= 10;
  } while (code > 0);

  for (i = (pbuf - buf); i < length; i++) {
    *(pbuf++) = '0';
  }

  *pbuf = '\0';

  len = pbuf - buf;

  for (i = 0; i < len / 2; i++) {
    char tmp = buf[i];
    buf[i] = buf[len - i - 1];
    buf[len - i - 1] = tmp;
  }
}